

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O2

int cuddHashTableResize(DdHashTable *hash)

{
  uint keysize;
  DdHashItem **__ptr;
  DdHashItem *pDVar1;
  int extraout_EAX;
  DdHashItem **ppDVar2;
  ulong uVar3;
  byte bVar4;
  DdHashItem *pDVar5;
  int shift;
  uint uVar6;
  ulong uVar7;
  
  __ptr = hash->bucket;
  uVar6 = hash->numBuckets;
  ppDVar2 = (DdHashItem **)calloc(1,(long)(int)(uVar6 * 2) << 3);
  if (ppDVar2 != (DdHashItem **)0x0) {
    hash->bucket = ppDVar2;
    hash->numBuckets = uVar6 * 2;
    keysize = hash->keysize;
    shift = hash->shift + -1;
    hash->shift = shift;
    hash->maxsize = hash->maxsize << 1;
    uVar7 = 0;
    if (0 < (int)uVar6) {
      uVar7 = (ulong)uVar6;
    }
    bVar4 = (byte)shift;
    if (keysize == 1) {
      for (uVar3 = 0; uVar3 != uVar7; uVar3 = uVar3 + 1) {
        pDVar5 = __ptr[uVar3];
        while (pDVar5 != (DdHashItem *)0x0) {
          pDVar1 = pDVar5->next;
          uVar6 = (((uint)pDVar5->key[0] & 1) +
                  *(int *)(((ulong)pDVar5->key[0] & 0xfffffffffffffffe) + 0x20) * 2) * 0x7c45abd6 >>
                  (bVar4 & 0x1f);
          pDVar5->next = ppDVar2[uVar6];
          ppDVar2[uVar6] = pDVar5;
          pDVar5 = pDVar1;
        }
      }
    }
    else if (keysize == 2) {
      for (uVar3 = 0; uVar3 != uVar7; uVar3 = uVar3 + 1) {
        pDVar5 = __ptr[uVar3];
        while (pDVar5 != (DdHashItem *)0x0) {
          pDVar1 = pDVar5->next;
          uVar6 = (((uint)pDVar5[1].next & 1) +
                   *(int *)(((ulong)pDVar5[1].next & 0xfffffffffffffffe) + 0x20) * 2 +
                  (((uint)pDVar5->key[0] & 1) +
                  *(int *)(((ulong)pDVar5->key[0] & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                  0x40f1f9 >> (bVar4 & 0x1f);
          pDVar5->next = ppDVar2[uVar6];
          ppDVar2[uVar6] = pDVar5;
          pDVar5 = pDVar1;
        }
      }
    }
    else if (keysize == 3) {
      for (uVar3 = 0; uVar3 != uVar7; uVar3 = uVar3 + 1) {
        pDVar5 = __ptr[uVar3];
        while (pDVar5 != (DdHashItem *)0x0) {
          pDVar1 = pDVar5->next;
          uVar6 = (((uint)pDVar5[1].count & 1) +
                   *(int *)((pDVar5[1].count & 0xfffffffffffffffeU) + 0x20) * 2 +
                  (((uint)pDVar5->key[0] & 1) +
                   *(int *)(((ulong)pDVar5->key[0] & 0xfffffffffffffffe) + 0x20) * 2 +
                  ((uint)pDVar5[1].next & 1) +
                  *(int *)(((ulong)pDVar5[1].next & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                  0x40f1f9 >> (bVar4 & 0x1f);
          pDVar5->next = ppDVar2[uVar6];
          ppDVar2[uVar6] = pDVar5;
          pDVar5 = pDVar1;
        }
      }
    }
    else {
      for (uVar3 = 0; uVar3 != uVar7; uVar3 = uVar3 + 1) {
        pDVar5 = __ptr[uVar3];
        while (pDVar5 != (DdHashItem *)0x0) {
          pDVar1 = pDVar5->next;
          uVar6 = ddLCHash(pDVar5->key,keysize,shift);
          pDVar5->next = ppDVar2[uVar6];
          ppDVar2[uVar6] = pDVar5;
          pDVar5 = pDVar1;
        }
      }
    }
    free(__ptr);
    return extraout_EAX;
  }
  hash->maxsize = hash->maxsize << 1;
  return (int)ppDVar2;
}

Assistant:

static int
cuddHashTableResize(
  DdHashTable * hash)
{
    int j;
    unsigned int posn;
    DdHashItem *item;
    DdHashItem *next;
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
    DdNode **key;
    int numBuckets;
    DdHashItem **buckets;
    DdHashItem **oldBuckets = hash->bucket;
#ifdef __osf__
#pragma pointer_size restore
#endif
    int shift;
    int oldNumBuckets = hash->numBuckets;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

    /* Compute the new size of the table. */
    numBuckets = oldNumBuckets << 1;
    saveHandler = MMoutOfMemory;
    MMoutOfMemory = Cudd_OutOfMem;
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
    buckets = ABC_ALLOC(DdHashItem *, numBuckets);
    MMoutOfMemory = saveHandler;
    if (buckets == NULL) {
        hash->maxsize <<= 1;
        return(1);
    }

    hash->bucket = buckets;
    hash->numBuckets = numBuckets;
    shift = --(hash->shift);
    hash->maxsize <<= 1;
    memset(buckets, 0, numBuckets * sizeof(DdHashItem *));
#ifdef __osf__
#pragma pointer_size restore
#endif
    if (hash->keysize == 1) {
        for (j = 0; j < oldNumBuckets; j++) {
            item = oldBuckets[j];
            while (item != NULL) {
                next = item->next;
                key = item->key;
                posn = ddLCHash2(cuddF2L(key[0]), cuddF2L(key[0]), shift);
                item->next = buckets[posn];
                buckets[posn] = item;
                item = next;
            }
        }
    } else if (hash->keysize == 2) {
        for (j = 0; j < oldNumBuckets; j++) {
            item = oldBuckets[j];
            while (item != NULL) {
                next = item->next;
                key = item->key;
                posn = ddLCHash2(cuddF2L(key[0]), cuddF2L(key[1]), shift);
                item->next = buckets[posn];
                buckets[posn] = item;
                item = next;
            }
        }
    } else if (hash->keysize == 3) {
        for (j = 0; j < oldNumBuckets; j++) {
            item = oldBuckets[j];
            while (item != NULL) {
                next = item->next;
                key = item->key;
                posn = ddLCHash3(cuddF2L(key[0]), cuddF2L(key[1]), cuddF2L(key[2]), shift);
                item->next = buckets[posn];
                buckets[posn] = item;
                item = next;
            }
        }
    } else {
        for (j = 0; j < oldNumBuckets; j++) {
            item = oldBuckets[j];
            while (item != NULL) {
                next = item->next;
                posn = ddLCHash(item->key, hash->keysize, shift);
                item->next = buckets[posn];
                buckets[posn] = item;
                item = next;
            }
        }
    }
    ABC_FREE(oldBuckets);
    return(1);

}